

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::Mesh::createColocals(Mesh *this)

{
  Array<unsigned_int> *this_00;
  uint8_t *puVar1;
  float *pfVar2;
  undefined8 uVar3;
  float newCapacity;
  uint uVar4;
  uint8_t *puVar5;
  bool bVar6;
  uint32_t uVar7;
  float fVar8;
  ulong uVar9;
  ulong uVar10;
  char *__function;
  long lVar11;
  uint32_t newBufferSize;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Array<unsigned_int> colocals;
  uint32_t otherVertex;
  Array<unsigned_int> potential;
  BVH bvh;
  float local_d4;
  ArrayBase local_d0;
  AABB local_b8;
  ArrayBase local_98;
  ArrayBase local_80;
  BVH local_68;
  
  newCapacity = (float)(this->m_positions).m_base.size;
  local_98.buffer = (uint8_t *)0x0;
  local_98.elementSize = 0x18;
  local_98.capacity = 0;
  local_98.size = (uint32_t)newCapacity;
  if ((ulong)(uint)newCapacity != 0) {
    ArrayBase::setArrayCapacity(&local_98,(uint32_t)newCapacity);
    uVar10 = (ulong)(this->m_positions).m_base.size;
    if (uVar10 != 0) {
      puVar5 = (this->m_positions).m_base.buffer;
      lVar11 = 0;
      do {
        fVar8 = this->m_epsilon;
        fVar14 = *(float *)(puVar5 + lVar11);
        uVar3 = *(undefined8 *)(puVar5 + lVar11 + 4);
        fVar15 = (float)uVar3;
        fVar12 = (float)((ulong)uVar3 >> 0x20);
        fVar13 = fVar14;
        fVar16 = fVar15;
        fVar17 = fVar12;
        if (0.0 < fVar8) {
          fVar13 = fVar14 - fVar8;
          fVar16 = fVar15 - fVar8;
          fVar17 = fVar12 - fVar8;
          fVar14 = fVar8 + fVar14;
          fVar15 = fVar8 + fVar15;
          fVar12 = fVar12 + fVar8;
        }
        if ((ulong)local_98.size * 0xc == lVar11) {
          __function = 
          "T &xatlas::internal::Array<xatlas::internal::AABB>::operator[](uint32_t) [T = xatlas::internal::AABB]"
          ;
          goto LAB_001aab5e;
        }
        *(float *)(local_98.buffer + lVar11 * 2) = fVar13;
        pfVar2 = (float *)(local_98.buffer + lVar11 * 2 + 4);
        *pfVar2 = fVar16;
        pfVar2[1] = fVar17;
        pfVar2[2] = fVar14;
        pfVar2[3] = fVar15;
        *(float *)(local_98.buffer + lVar11 * 2 + 0x14) = fVar12;
        lVar11 = lVar11 + 0xc;
      } while (uVar10 * 0xc != lVar11);
    }
  }
  BVH::BVH(&local_68,(Array<xatlas::internal::AABB> *)&local_98,4);
  local_d0.buffer = (uint8_t *)0x0;
  local_d0.elementSize = 4;
  local_d0.size = 0;
  local_d0.capacity = 0;
  local_80.buffer = (uint8_t *)0x0;
  local_80.elementSize = 4;
  local_80.size = 0;
  local_80.capacity = 0;
  this->m_colocalVertexCount = 0;
  this_00 = &this->m_nextColocalVertex;
  (this->m_nextColocalVertex).m_base.size = (uint32_t)newCapacity;
  if ((this->m_nextColocalVertex).m_base.capacity < (uint)newCapacity) {
    ArrayBase::setArrayCapacity(&this_00->m_base,(uint32_t)newCapacity);
  }
  else if (newCapacity == 0.0) goto LAB_001aaaeb;
  puVar5 = (this_00->m_base).buffer;
  uVar10 = 0;
  do {
    if ((this->m_nextColocalVertex).m_base.size <= uVar10) goto LAB_001aab49;
    puVar1 = puVar5 + uVar10 * 4;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
    uVar10 = uVar10 + 1;
  } while ((uint)newCapacity != uVar10);
  local_d4 = 0.0;
  if (newCapacity != 0.0) {
    uVar10 = 0;
    do {
      if ((this->m_nextColocalVertex).m_base.size <= (uint)(float)uVar10) {
LAB_001aab49:
        __function = 
        "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
LAB_001aab5e:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,__function);
      }
      fVar8 = (float)uVar10;
      if (*(int *)((this_00->m_base).buffer + uVar10 * 4) == -1) {
        local_d0._8_8_ = local_d0._8_8_ & 0xffffffff;
        ArrayBase::push_back(&local_d0,(uint8_t *)&local_d4);
        uVar10 = (ulong)(uint)local_d4;
        if ((this->m_positions).m_base.size <= (uint)local_d4) {
LAB_001aab32:
          __function = 
          "T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) [T = xatlas::internal::Vector3]"
          ;
          goto LAB_001aab5e;
        }
        puVar5 = (this->m_positions).m_base.buffer;
        fVar8 = this->m_epsilon;
        local_b8.min.z = *(float *)(puVar5 + uVar10 * 0xc + 8);
        local_b8.min._0_8_ = *(undefined8 *)(puVar5 + uVar10 * 0xc);
        local_b8.max.z = *(float *)(puVar5 + uVar10 * 0xc + 8);
        local_b8.max.x = (float)*(undefined8 *)(puVar5 + uVar10 * 0xc);
        local_b8.max.y = (float)((ulong)*(undefined8 *)(puVar5 + uVar10 * 0xc) >> 0x20);
        if (0.0 < fVar8) {
          local_b8.min.z = local_b8.min.z - fVar8;
          local_b8.max.x = local_b8.max.x + fVar8;
          local_b8.min.y = local_b8.min.y - fVar8;
          local_b8.min.x = local_b8.min.x - fVar8;
          local_b8.max.y = local_b8.max.y + fVar8;
          local_b8.max.z = local_b8.max.z + fVar8;
        }
        BVH::query(&local_68,&local_b8,(Array<unsigned_int> *)&local_80);
        if (local_80.size != 0) {
          uVar10 = 0;
          uVar7 = local_80.size;
          do {
            fVar8 = *(float *)(local_80.buffer + uVar10 * 4);
            uVar9 = (ulong)(uint)fVar8;
            local_b8.min.x = fVar8;
            if (fVar8 != local_d4) {
              fVar14 = (float)(this->m_positions).m_base.size;
              if (((uint)fVar14 <= (uint)local_d4) || ((uint)fVar14 <= (uint)fVar8))
              goto LAB_001aab32;
              puVar5 = (this->m_positions).m_base.buffer;
              pfVar2 = (float *)(puVar5 + (ulong)(uint)local_d4 * 0xc);
              fVar14 = this->m_epsilon;
              if (((ABS(*pfVar2 - *(float *)(puVar5 + uVar9 * 0xc)) <= fVar14) &&
                  (ABS(pfVar2[1] - *(float *)(puVar5 + uVar9 * 0xc + 4)) <= fVar14)) &&
                 (ABS(pfVar2[2] - *(float *)(puVar5 + uVar9 * 0xc + 8)) <= fVar14)) {
                if ((this->m_nextColocalVertex).m_base.size <= (uint)fVar8) goto LAB_001aab49;
                if (*(int *)((this_00->m_base).buffer + uVar9 * 4) == -1) {
                  ArrayBase::push_back(&local_d0,(uint8_t *)&local_b8);
                  uVar7 = local_80.size;
                }
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar7);
        }
        fVar8 = local_d4;
        if ((ulong)local_d0.size == 1) {
          if ((this->m_nextColocalVertex).m_base.size <= (uint)local_d4) goto LAB_001aab49;
          *(float *)((this_00->m_base).buffer + (ulong)(uint)local_d4 * 4) = local_d4;
        }
        else {
          this->m_colocalVertexCount = this->m_colocalVertexCount + local_d0.size;
          if (1 < (int)local_d0.size) {
            uVar10 = 1;
            do {
              uVar4 = *(uint *)(local_d0.buffer + uVar10 * 4);
              uVar9 = uVar10;
              do {
                if (*(uint *)(local_d0.buffer + (uVar9 - 1 & 0xffffffff) * 4) <= uVar4)
                goto LAB_001aaa81;
                *(uint *)(local_d0.buffer + uVar9 * 4) =
                     *(uint *)(local_d0.buffer + (uVar9 - 1 & 0xffffffff) * 4);
                bVar6 = 1 < (long)uVar9;
                uVar9 = uVar9 - 1;
              } while (bVar6);
              uVar9 = 0;
LAB_001aaa81:
              *(uint *)(local_d0.buffer + (long)(int)uVar9 * 4) = uVar4;
              uVar10 = uVar10 + 1;
            } while (uVar10 != local_d0.size);
          }
          if (local_d0.size != 0) {
            puVar5 = (this_00->m_base).buffer;
            uVar10 = 0;
            do {
              lVar11 = uVar10 * 4;
              if ((this->m_nextColocalVertex).m_base.size <= *(uint *)(local_d0.buffer + lVar11))
              goto LAB_001aab49;
              uVar10 = uVar10 + 1;
              uVar9 = uVar10 & 0xffffffff;
              if ((uint)uVar10 == local_d0.size) {
                uVar9 = 0;
              }
              *(undefined4 *)(puVar5 + (ulong)*(uint *)(local_d0.buffer + lVar11) * 4) =
                   *(undefined4 *)(local_d0.buffer + uVar9 * 4);
            } while ((uint)uVar10 < local_d0.size);
          }
          if ((this->m_nextColocalVertex).m_base.size <= (uint)local_d4) goto LAB_001aab49;
          if (*(int *)((this_00->m_base).buffer + (ulong)(uint)local_d4 * 4) == -1) {
            __assert_fail("m_nextColocalVertex[i] != (4294967295U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x9d8,"void xatlas::internal::Mesh::createColocals()");
          }
        }
      }
      local_d4 = (float)((int)fVar8 + 1);
      uVar10 = (ulong)(uint)local_d4;
    } while ((uint)local_d4 < (uint)newCapacity);
  }
LAB_001aaaeb:
  ArrayBase::~ArrayBase(&local_80);
  ArrayBase::~ArrayBase(&local_d0);
  ArrayBase::~ArrayBase(&local_68.m_nodes.m_base);
  ArrayBase::~ArrayBase(&local_68.m_objectIds.m_base);
  ArrayBase::~ArrayBase(&local_98);
  return;
}

Assistant:

void createColocals()
	{
		const uint32_t vertexCount = m_positions.size();
		Array<AABB> aabbs(MemTag::BVH);
		aabbs.resize(vertexCount);
		for (uint32_t i = 0; i < m_positions.size(); i++)
			aabbs[i] = AABB(m_positions[i], m_epsilon);
		BVH bvh(aabbs);
		Array<uint32_t> colocals(MemTag::MeshColocals);
		Array<uint32_t> potential(MemTag::MeshColocals);
		m_colocalVertexCount = 0;
		m_nextColocalVertex.resize(vertexCount);
		for (uint32_t i = 0; i < vertexCount; i++)
			m_nextColocalVertex[i] = UINT32_MAX;
		for (uint32_t i = 0; i < vertexCount; i++) {
			if (m_nextColocalVertex[i] != UINT32_MAX)
				continue; // Already linked.
			// Find other vertices colocal to this one.
			colocals.clear();
			colocals.push_back(i); // Always add this vertex.
			bvh.query(AABB(m_positions[i], m_epsilon), potential);
			for (uint32_t j = 0; j < potential.size(); j++) {
				const uint32_t otherVertex = potential[j];
				if (otherVertex != i && equal(m_positions[i], m_positions[otherVertex], m_epsilon) && m_nextColocalVertex[otherVertex] == UINT32_MAX)
					colocals.push_back(otherVertex);
			}
			if (colocals.size() == 1) {
				// No colocals for this vertex.
				m_nextColocalVertex[i] = i;
				continue; 
			}
			m_colocalVertexCount += colocals.size();
			// Link in ascending order.
			insertionSort(colocals.data(), colocals.size());
			for (uint32_t j = 0; j < colocals.size(); j++)
				m_nextColocalVertex[colocals[j]] = colocals[(j + 1) % colocals.size()];
			XA_DEBUG_ASSERT(m_nextColocalVertex[i] != UINT32_MAX);
		}
	}